

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.h
# Opt level: O1

_Rb_tree_node<std::pair<double,_long>_> * __thiscall
HighsNodeQueue::NodesetAllocator<std::_Rb_tree_node<std::pair<double,_long>_>_>::allocate
          (NodesetAllocator<std::_Rb_tree_node<std::pair<double,_long>_>_> *this,size_type n)

{
  AllocatorState *pAVar1;
  _Rb_tree_node<std::pair<double,_long>_> *p_Var2;
  Chunk *pCVar3;
  _Rb_tree_node<std::pair<double,_long>_> *p_Var4;
  
  if (n == 1) {
    pAVar1 = this->state;
    p_Var2 = (_Rb_tree_node<std::pair<double,_long>_> *)pAVar1->freeListHead;
    if (p_Var2 == (_Rb_tree_node<std::pair<double,_long>_> *)0x0) {
      p_Var2 = (_Rb_tree_node<std::pair<double,_long>_> *)pAVar1->currChunkStart;
      if ((p_Var2 == (_Rb_tree_node<std::pair<double,_long>_> *)0x0) ||
         (p_Var4 = p_Var2 + 1,
         (_Rb_tree_node<std::pair<double,_long>_> *)pAVar1->currChunkEnd < p_Var4)) {
        pCVar3 = (Chunk *)operator_new(0x1000);
        pCVar3->next = pAVar1->chunkListHead;
        pAVar1->chunkListHead = pCVar3;
        p_Var2 = (_Rb_tree_node<std::pair<double,_long>_> *)&pCVar3->storage;
        pAVar1->currChunkEnd = (char *)(pCVar3 + 1);
        p_Var4 = (_Rb_tree_node<std::pair<double,_long>_> *)((long)&pCVar3->storage + 0x30);
      }
      pAVar1->currChunkStart = (char *)p_Var4;
    }
    else {
      pAVar1->freeListHead = *(void **)&p_Var2->super__Rb_tree_node_base;
    }
    return p_Var2;
  }
  p_Var2 = (_Rb_tree_node<std::pair<double,_long>_> *)operator_new(n * 0x30);
  return p_Var2;
}

Assistant:

T* allocate(size_type n) {
      if (n == 1) {
        T* ptr = reinterpret_cast<T*>(state->freeListHead);
        if (ptr) {
          state->freeListHead =
              reinterpret_cast<FreelistNode*>(state->freeListHead)->next;
        } else {
          ptr = reinterpret_cast<T*>(state->currChunkStart);
          if (!ptr || state->currChunkStart + sizeof(FreelistNode) >
                          state->currChunkEnd) {
            auto newChunk = new Chunk;
            newChunk->next = state->chunkListHead;
            state->chunkListHead = newChunk;
            state->currChunkStart = reinterpret_cast<char*>(&newChunk->storage);
            state->currChunkEnd =
                state->currChunkStart + sizeof(newChunk->storage);
            ptr = reinterpret_cast<T*>(state->currChunkStart);
            state->currChunkStart += sizeof(FreelistNode);
          } else {
            state->currChunkStart += sizeof(FreelistNode);
          }
        }
        return ptr;
      }

      return static_cast<T*>(::operator new(n * sizeof(T)));
    }